

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_flow.cc
# Opt level: O0

void __thiscall re2c::Skeleton::warn_undefined_control_flow(Skeleton *this)

{
  uint32_t line;
  bool bVar1;
  nakeds_t local_44;
  undefined1 local_40 [4];
  nakeds_t size;
  vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
  ways;
  way_t prefix;
  Skeleton *this_local;
  
  std::
  vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
  ::vector((vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
            *)&ways.
               super__Vector_base<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
  ::vector((vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
            *)local_40);
  local_44.value = (uint32_t)u32lim_t<1024U>::from32(0);
  Node::naked_ways(this->nodes,
                   (way_t *)&ways.
                             super__Vector_base<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
                    *)local_40,&local_44);
  bVar1 = std::
          vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
          ::empty((vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
                   *)local_40);
  if (bVar1) {
    bVar1 = u32lim_t<1024U>::overflow(&local_44);
    if (bVar1) {
      Warn::fail((Warn *)warn,UNDEFINED_CONTROL_FLOW,this->line,
                 "DFA is too large to check undefined control flow");
    }
  }
  else {
    line = this->line;
    bVar1 = u32lim_t<1024U>::overflow(&local_44);
    Warn::undefined_control_flow
              ((Warn *)warn,line,&this->cond,
               (vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
                *)local_40,bVar1);
  }
  std::
  vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
  ::~vector((vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
             *)local_40);
  std::
  vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
  ::~vector((vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
             *)&ways.
                super__Vector_base<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Skeleton::warn_undefined_control_flow ()
{
	way_t prefix;
	std::vector<way_t> ways;
	Node::nakeds_t size = Node::nakeds_t::from32(0u);

	nodes->naked_ways (prefix, ways, size);

	if (!ways.empty ())
	{
		warn.undefined_control_flow (line, cond, ways, size.overflow ());
	}
	else if (size.overflow ())
	{
		warn.fail (Warn::UNDEFINED_CONTROL_FLOW, line, "DFA is too large to check undefined control flow");
	}
}